

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PFloat::ReadValue(PFloat *this,FArchive *ar,void *addr)

{
  bool bVar1;
  double local_38;
  double val;
  double *pdStack_28;
  BYTE tag;
  void *addr_local;
  FArchive *ar_local;
  PFloat *this_local;
  
  pdStack_28 = (double *)addr;
  addr_local = ar;
  ar_local = (FArchive *)this;
  FArchive::operator<<(ar,(BYTE *)((long)&val + 7));
  bVar1 = ReadValueDbl((FArchive *)addr_local,&local_38,(uint)val._7_1_);
  if (bVar1) {
    if (*(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24 == 4) {
      *(float *)pdStack_28 = (float)local_38;
    }
    else {
      *pdStack_28 = local_38;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PFloat::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	double val;
	if (ReadValueDbl(ar, &val, tag))
	{
		if (Size == 4)
		{
			*(float *)addr = (float)val;
		}
		else
		{
			*(double *)addr = val;
		}
		return true;
	}
	return false;
}